

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O3

void __thiscall AudioFileRenderer::~AudioFileRenderer(AudioFileRenderer *this)

{
  MidiParser *pMVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  int __fd;
  QDeadlineTimer QVar5;
  
  *(undefined ***)this = &PTR_metaObject_001c8198;
  this->stopProcessing = true;
  QVar5.t2 = 0xffffffff;
  QVar5.type = 0x7fffffff;
  QVar5.t1 = (qint64)this;
  __fd = -1;
  QThread::wait(QVar5);
  if ((this->realtimeMode == false) && ((this->audioRenderer).synth != (QSynth *)0x0)) {
    QSynth::close((this->audioRenderer).synth,__fd);
    if ((this->audioRenderer).audioStream != (AudioFileWriterStream *)0x0) {
      (*(((this->audioRenderer).audioStream)->super_AudioStream)._vptr_AudioStream[4])();
    }
  }
  pMVar1 = this->parsers;
  if (pMVar1 != (MidiParser *)0x0) {
    lVar2 = *(long *)&pMVar1[-1].division;
    if (lVar2 != 0) {
      lVar4 = lVar2 << 6;
      do {
        *(undefined ***)((long)&pMVar1[-1].super_MidiStreamSource._vptr_MidiStreamSource + lVar4) =
             &PTR__MidiParser_001cba78;
        QArrayDataPointer<QMidiEvent>::~QArrayDataPointer
                  ((QArrayDataPointer<QMidiEvent> *)((long)pMVar1 + lVar4 + -0x28));
        QFile::~QFile((QFile *)((long)pMVar1 + lVar4 + -0x38));
        lVar4 = lVar4 + -0x40;
      } while (lVar4 != 0);
    }
    operator_delete__(&pMVar1[-1].division,lVar2 << 6 | 8);
  }
  if (this->buffer != (qint16 *)0x0) {
    operator_delete__(this->buffer);
  }
  pDVar3 = (this->outFileName).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->outFileName).d.d)->super_QArrayData,2,8);
    }
  }
  QThread::~QThread(&this->super_QThread);
  return;
}

Assistant:

AudioFileRenderer::~AudioFileRenderer() {
	stop();
	if (!realtimeMode && audioRenderer.synth != NULL) {
		audioRenderer.synth->close();
		delete audioRenderer.synth;
	}
	delete[] parsers;
	delete[] buffer;
}